

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O3

MPP_RET vdpu_av1d_deinit(void *hal)

{
  int iVar1;
  long lVar2;
  MPP_RET MVar3;
  undefined8 in_RAX;
  undefined8 *puVar4;
  ulong uVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  
  lVar2 = *(long *)((long)hal + 0x50);
  iVar1 = *(int *)((long)hal + 0x58);
  puVar4 = (undefined8 *)(lVar2 + 8);
  uVar5 = 0;
  do {
    if ((void *)*puVar4 != (void *)0x0) {
      mpp_osal_free("hal_av1d_release_res",(void *)*puVar4);
    }
    uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
    *puVar4 = 0;
    if (iVar1 == 0) break;
    puVar4 = puVar4 + 2;
    bVar6 = uVar5 < 2;
    uVar5 = uVar5 + 1;
  } while (bVar6);
  if (*(MppBuffer *)(lVar2 + 0x30) != (MppBuffer)0x0) {
    MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 0x30),"hal_av1d_release_res");
    if (MVar3 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf2);
      }
      if ((hal_av1d_debug & 2) != 0) {
        uVar7 = CONCAT44(uVar8,0xf2);
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",uVar7);
        uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00215d50;
      }
    }
  }
  if (*(MppBuffer *)(lVar2 + 0x38) != (MppBuffer)0x0) {
    MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 0x38),"hal_av1d_release_res");
    if (MVar3 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf3);
      }
      if ((hal_av1d_debug & 2) != 0) {
        uVar7 = CONCAT44(uVar8,0xf3);
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",uVar7);
        uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00215d50;
      }
    }
  }
  if (*(MppBuffer *)(lVar2 + 0x40) != (MppBuffer)0x0) {
    MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 0x40),"hal_av1d_release_res");
    if (MVar3 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf4);
      }
      if ((hal_av1d_debug & 2) != 0) {
        uVar7 = CONCAT44(uVar8,0xf4);
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",uVar7);
        uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00215d50;
      }
    }
  }
  if (*(MppBuffer *)(lVar2 + 0x48) != (MppBuffer)0x0) {
    MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 0x48),"hal_av1d_release_res");
    if (MVar3 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf5);
      }
      if ((hal_av1d_debug & 2) != 0) {
        uVar7 = CONCAT44(uVar8,0xf5);
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",uVar7);
        uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00215d50;
      }
    }
  }
  if (*(MppBuffer *)(lVar2 + 0x50) != (MppBuffer)0x0) {
    MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 0x50),"hal_av1d_release_res");
    if (MVar3 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf6);
      }
      if ((hal_av1d_debug & 2) != 0) {
        uVar7 = CONCAT44(uVar8,0xf6);
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",uVar7);
        uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00215d50;
      }
    }
  }
  if (*(MppBuffer *)(lVar2 + 0x60) != (MppBuffer)0x0) {
    MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 0x60),"hal_av1d_release_res");
    if (MVar3 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf7);
      }
      if ((hal_av1d_debug & 2) != 0) {
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",CONCAT44(uVar8,0xf7));
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00215d50:
          abort();
        }
      }
    }
  }
  vdpu_av1d_filtermem_release(*(VdpuAv1dRegCtx **)(lVar2 + 0x58));
  hal_bufs_deinit(*(HalBufs *)(lVar2 + 0x1e7b0));
  if (*(void **)((long)hal + 0x50) != (void *)0x0) {
    mpp_osal_free("hal_av1d_release_res",*(void **)((long)hal + 0x50));
  }
  *(undefined8 *)((long)hal + 0x50) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET vdpu_av1d_deinit(void *hal)
{
    hal_av1d_release_res(hal);

    return MPP_OK;
}